

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftOffRequest.h
# Opt level: O2

bool __thiscall ShiftOffRequest::operator==(ShiftOffRequest *this,ShiftOffRequest *shiftOffRequest)

{
  __type _Var1;
  string *psVar2;
  
  psVar2 = getNurse_abi_cxx11_(shiftOffRequest);
  _Var1 = std::operator==(&this->nurse,psVar2);
  if (!_Var1) {
    psVar2 = getDay_abi_cxx11_(shiftOffRequest);
    _Var1 = std::operator==(&this->day,psVar2);
    if (!_Var1) {
      psVar2 = getShiftType_abi_cxx11_(shiftOffRequest);
      _Var1 = std::operator==(&this->shiftType,psVar2);
      return _Var1;
    }
  }
  return true;
}

Assistant:

bool operator== (const ShiftOffRequest& shiftOffRequest) {
        return nurse ==shiftOffRequest.getNurse() ||  day == shiftOffRequest.getDay() || shiftType ==shiftOffRequest.getShiftType();
    }